

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask16_32(uint32_t *in,uint32_t *out)

{
  long in_RAX;
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  
  vpmovsxbd_avx512f(_DAT_001a6390);
  auVar1 = vpgatherdd_avx512f(*(undefined4 *)((long)in + in_RAX));
  auVar2 = vmovdqu64_avx512f(auVar1);
  *(undefined1 (*) [64])out = auVar2;
  vpmovsxbd_avx512f(_DAT_001a63a0);
  auVar2 = vpgatherdd_avx512f(*(undefined4 *)((long)in + in_RAX));
  auVar2 = vpslld_avx512f(auVar2,0x10);
  auVar2 = vpord_avx512f(auVar2,auVar1);
  auVar2 = vmovdqu64_avx512f(auVar2);
  *(undefined1 (*) [64])out = auVar2;
  return out + 0x10;
}

Assistant:

uint32_t *__fastpackwithoutmask16_32(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;

  return out;
}